

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O2

string * __thiscall
chaiscript::AST_Node::to_string(string *__return_storage_ptr__,AST_Node *this,string *t_prepend)

{
  AST_Node *this_00;
  ostream *poVar1;
  pointer prVar2;
  _Vector_base<std::reference_wrapper<chaiscript::AST_Node>,_std::allocator<std::reference_wrapper<chaiscript::AST_Node>_>_>
  local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string local_1c8;
  ostringstream oss;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar1 = std::operator<<((ostream *)&oss,(string *)t_prepend);
  poVar1 = std::operator<<(poVar1,"(");
  poVar1 = std::operator<<(poVar1,&DAT_003ef620 +
                                  *(int *)(&DAT_003ef620 + (long)(int)this->identifier * 4));
  poVar1 = std::operator<<(poVar1,") ");
  poVar1 = std::operator<<(poVar1,(string *)&this->text);
  poVar1 = std::operator<<(poVar1," : ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->location).start.line);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->location).start.column);
  std::operator<<(poVar1,'\n');
  (**this->_vptr_AST_Node)(&local_200,this);
  for (prVar2 = local_200._M_impl.super__Vector_impl_data._M_start;
      prVar2 != local_200._M_impl.super__Vector_impl_data._M_finish; prVar2 = prVar2 + 1) {
    this_00 = prVar2->_M_data;
    std::operator+(&local_1e8,t_prepend,"  ");
    to_string(&local_1c8,this_00,&local_1e8);
    std::operator<<((ostream *)&oss,(string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1e8);
  }
  std::
  _Vector_base<std::reference_wrapper<chaiscript::AST_Node>,_std::allocator<std::reference_wrapper<chaiscript::AST_Node>_>_>
  ::~_Vector_base(&local_200);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const std::string &t_prepend = "") const {
      std::ostringstream oss;

      oss << t_prepend << "(" << ast_node_type_to_string(this->identifier) << ") " << this->text << " : " << this->location.start.line
          << ", " << this->location.start.column << '\n';

      for (auto &elem : get_children()) {
        oss << elem.get().to_string(t_prepend + "  ");
      }
      return oss.str();
    }